

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

char * getShapeForTarget(cmTarget *target)

{
  TargetType TVar1;
  cmTarget *target_local;
  
  if (target == (cmTarget *)0x0) {
    target_local = (cmTarget *)anon_var_dwarf_394111;
  }
  else {
    TVar1 = cmTarget::GetType(target);
    switch(TVar1) {
    case EXECUTABLE:
      target_local = (cmTarget *)anon_var_dwarf_39411b;
      break;
    case STATIC_LIBRARY:
      target_local = (cmTarget *)anon_var_dwarf_394125;
      break;
    case SHARED_LIBRARY:
      target_local = (cmTarget *)anon_var_dwarf_39412f;
      break;
    case MODULE_LIBRARY:
      target_local = (cmTarget *)anon_var_dwarf_394139;
      break;
    default:
      target_local = (cmTarget *)anon_var_dwarf_394143;
    }
  }
  return (char *)target_local;
}

Assistant:

static const char* getShapeForTarget(const cmTarget* target)
{
  if (!target)
    {
    return "ellipse";
    }

  switch ( target->GetType() )
    {
    case cmTarget::EXECUTABLE:
      return "house";
    case cmTarget::STATIC_LIBRARY:
      return "diamond";
    case cmTarget::SHARED_LIBRARY:
      return "polygon";
    case cmTarget::MODULE_LIBRARY:
      return "octagon";
    default:
      break;
    }

  return "box";
}